

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

size_type __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::find_last_of
          (basic_string_view<char,_std::char_traits<char>_> *this,
          basic_string_view<char,_std::char_traits<char>_> v,size_type pos)

{
  char *pcVar1;
  ulong uVar2;
  const_pointer pcVar3;
  ulong uVar4;
  const_pointer pcVar5;
  size_type sVar6;
  const_pointer pcVar7;
  size_type sVar8;
  bool bVar9;
  
  sVar6 = v.size_;
  uVar2 = this->size_;
  do {
    uVar4 = pos;
    if (uVar2 == 0) {
      return 0xffffffffffffffff;
    }
    pos = uVar2 - 1;
  } while (uVar2 <= uVar4);
  pcVar3 = this->data_;
  pcVar5 = pcVar3 + uVar4 + 1;
  pcVar7 = pcVar3;
  if (pcVar5 != pcVar3) {
    do {
      if (sVar6 != 0) {
        bVar9 = sVar6 == 0;
        if (pcVar5[-1] != *v.data_) {
          sVar8 = 1;
          do {
            bVar9 = sVar6 == sVar8;
            if (bVar9) goto LAB_00186cab;
            pcVar1 = v.data_ + sVar8;
            sVar8 = sVar8 + 1;
          } while (pcVar5[-1] != *pcVar1);
        }
        pcVar7 = pcVar5;
        if (!bVar9) break;
      }
LAB_00186cab:
      pcVar5 = pcVar5 + -1;
      pcVar7 = pcVar3;
    } while (pcVar5 != pcVar3);
  }
  pcVar5 = (const_pointer)0xffffffffffffffff;
  if (pcVar7 != pcVar3) {
    pcVar5 = pcVar7 + ~(ulong)pcVar3;
  }
  return (size_type)pcVar5;
}

Assistant:

nssv_constexpr size_type find_last_of(basic_string_view v, size_type pos = npos) const nssv_noexcept  // (1)
		{
			return empty() ? npos
						   : pos >= size() ? find_last_of(v, size() - 1)
										   : to_pos(std::find_first_of(const_reverse_iterator(cbegin() + pos + 1),
																	   crend(), v.cbegin(), v.cend(), Traits::eq));
		}